

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

size_t __thiscall QPDF::tableSize(QPDF *this)

{
  pointer pMVar1;
  size_type sVar2;
  pointer this_00;
  size_type sVar3;
  pointer this_01;
  int *piVar4;
  double dVar5;
  int local_90;
  int local_8c;
  size_type local_80;
  int local_78 [5];
  allocator<char> local_61;
  string local_60;
  int local_3c;
  undefined1 local_38 [4];
  int max_id;
  int local_2c;
  undefined1 local_28 [4];
  int max_obj;
  int local_1c;
  _Base_ptr p_Stack_18;
  int max_xref;
  QPDF *this_local;
  
  p_Stack_18 = (_Base_ptr)this;
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  sVar2 = std::
          map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
          ::size(&pMVar1->xref_table);
  if (sVar2 == 0) {
    local_8c = 0;
  }
  else {
    std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m);
    std::
    map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
    ::crbegin((map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
               *)local_28);
    this_00 = std::
              reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
              ::operator->((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                            *)local_28);
    local_8c = QPDFObjGen::getObj(&this_00->first);
  }
  local_1c = local_8c;
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  sVar3 = std::
          map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
          ::size(&pMVar1->obj_cache);
  if (sVar3 == 0) {
    local_90 = 0;
  }
  else {
    std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m);
    std::
    map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
    ::crbegin((map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
               *)local_38);
    this_01 = std::
              reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
              ::operator->((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                            *)local_38);
    local_90 = QPDFObjGen::getObj(&this_01->first);
  }
  local_2c = local_90;
  local_3c = std::numeric_limits<int>::max();
  local_3c = local_3c + -1;
  if ((local_3c <= local_2c) || (local_3c <= local_1c)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"Impossibly large object id encountered.",&local_61);
    stopOnError(this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  dVar5 = (double)local_2c;
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  local_80 = std::
             map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
             ::size(&pMVar1->obj_cache);
  local_78[0] = toI<unsigned_long>(&local_80);
  piVar4 = std::max<int>(local_78,&local_1c);
  if ((double)*piVar4 * 1.1 <= dVar5) {
    local_1c = local_1c + 1;
    this_local = (QPDF *)toS<int>(&local_1c);
  }
  else {
    local_2c = local_2c + 1;
    this_local = (QPDF *)toS<int>(&local_2c);
  }
  return (size_t)this_local;
}

Assistant:

size_t
QPDF::tableSize()
{
    // If obj_cache is dense, accommodate all object in tables,else accommodate only original
    // objects.
    auto max_xref = m->xref_table.size() ? m->xref_table.crbegin()->first.getObj() : 0;
    auto max_obj = m->obj_cache.size() ? m->obj_cache.crbegin()->first.getObj() : 0;
    auto max_id = std::numeric_limits<int>::max() - 1;
    if (max_obj >= max_id || max_xref >= max_id) {
        // Temporary fix. Long-term solution is
        // - QPDFObjGen to enforce objgens are valid and sensible
        // - xref table and obj cache to protect against insertion of impossibly large obj ids
        stopOnError("Impossibly large object id encountered.");
    }
    if (max_obj < 1.1 * std::max(toI(m->obj_cache.size()), max_xref)) {
        return toS(++max_obj);
    }
    return toS(++max_xref);
}